

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O2

Aig_Man_t *
LivenessToSafetyTransformationWithLTL
          (int mode,Abc_Ntk_t *pNtk,Aig_Man_t *p,Vec_Ptr_t *vLive,Vec_Ptr_t *vFair,
          Vec_Ptr_t *vAssertSafety,Vec_Ptr_t *vAssumeSafety,int *numLtlProcessed,
          Vec_Ptr_t *ltlBuffer)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *p_00;
  size_t sVar3;
  char *pcVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  char *pcVar8;
  Aig_Obj_t *pAVar9;
  void *pvVar10;
  Vec_Ptr_t *pVVar11;
  Vec_Ptr_t *p_01;
  ltlNode *plVar12;
  Vec_Ptr_t *pVVar13;
  Vec_Vec_t *vAigGFMap;
  void **ppvVar14;
  Aig_Obj_t *pAVar15;
  Vec_Ptr_t *pVVar16;
  ltlNode *astNode;
  int i;
  uint i_00;
  int iVar17;
  int iVar18;
  Vec_Ptr_t *local_a0;
  Aig_Obj_t *local_98;
  Aig_Obj_t *local_78;
  Aig_Obj_t *local_68;
  Vec_Ptr_t *local_60;
  Aig_Obj_t *local_50;
  Aig_Obj_t *local_48;
  
  vecPis = Vec_PtrAlloc(p->nTruePis + 1);
  vecPiNames = Vec_PtrAlloc(p->nTruePis + 1);
  vecLos = Vec_PtrAlloc(vFair->nSize + p->nRegs * 2 + vLive->nSize + 1);
  vecLoNames = Vec_PtrAlloc(vFair->nSize + p->nRegs * 2 + vLive->nSize + 1);
  *numLtlProcessed = 0;
  iVar17 = 0;
  if ((mode & 0xfffffffdU) == 0) {
    if (ltlBuffer == (Vec_Ptr_t *)0x0) {
      local_a0 = (Vec_Ptr_t *)0x0;
    }
    else {
      local_a0 = Vec_PtrAlloc(ltlBuffer->nSize);
      putchar(10);
      i_00 = 0;
      while ((int)i_00 < ltlBuffer->nSize) {
        pcVar8 = (char *)Vec_PtrEntry(ltlBuffer,i_00);
        plVar12 = parseFormulaCreateAST(pcVar8);
        i_00 = i_00 + 1;
        if (plVar12 == (ltlNode *)0x0) {
          pcVar8 = "\nNo AST has been created for formula %d, no extra logic will be added\n";
LAB_0049f9ba:
          printf(pcVar8,(ulong)i_00);
        }
        else {
          printf("Formula %d: AST is created, ",(ulong)i_00);
          iVar18 = isWellFormed(plVar12);
          if (iVar18 == 0) {
            puts("Well-formedness check FAILED!!");
LAB_0049f9b3:
            pcVar8 = 
            "AST will be ignored for formula %d, no extra logic will be added for this formula\n";
            goto LAB_0049f9ba;
          }
          printf("Well-formedness check PASSED, ");
          iVar18 = checkSignalNameExistence(pNtk,plVar12);
          if (iVar18 == 0) {
            printf("Signal check FAILED!!");
            goto LAB_0049f9b3;
          }
          puts("Signal check PASSED");
          Vec_PtrPush(local_a0,plVar12);
          *numLtlProcessed = *numLtlProcessed + 1;
        }
      }
    }
    putchar(10);
    if (local_a0->nSize == 0) {
      puts("\nCurrently aborting, need to take care when Vec_PtrSize( vTopASTNodeArray ) == 0");
      exit(0);
    }
  }
  else {
    local_a0 = (Vec_Ptr_t *)0x0;
  }
  p_00 = Aig_ManStart(p->vObjs->nSize * 2);
  pcVar8 = pNtk->pName;
  sVar3 = strlen(pcVar8);
  pcVar4 = (char *)malloc(sVar3 + 5);
  p_00->pName = pcVar4;
  sprintf(pcVar4,"%s_%s",pcVar8,"l3s");
  p_00->pSpec = (char *)0x0;
  pAVar5 = p->pConst1;
  pAVar5->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  for (; iVar17 < p->nTruePis; iVar17 = iVar17 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,iVar17);
    pAVar6 = Aig_ObjCreateCi(p_00);
    (pAVar5->field_5).pData = pAVar6;
    Vec_PtrPush(vecPis,pAVar6);
    pAVar7 = Abc_NtkPi(pNtk,iVar17);
    pcVar8 = Abc_ObjName(pAVar7);
    pcVar8 = Abc_UtilStrsav(pcVar8);
    Vec_PtrPush(vecPiNames,pcVar8);
  }
  iVar17 = 0;
  if ((mode & 0xfffffffdU) == 0) {
    pAVar6 = Aig_ObjCreateCi(p_00);
    Vec_PtrPush(vecPiNames,"SAVE_BIERE");
  }
  else {
    pAVar6 = (Aig_Obj_t *)0x0;
  }
  for (; iVar17 < p->nRegs; iVar17 = iVar17 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,p->nTruePis + iVar17);
    pAVar9 = Aig_ObjCreateCi(p_00);
    (pAVar5->field_5).pData = pAVar9;
    Vec_PtrPush(vecLos,pAVar9);
    pAVar7 = Abc_NtkCi(pNtk,pNtk->vPis->nSize + iVar17);
    pcVar8 = Abc_ObjName(pAVar7);
    pcVar8 = Abc_UtilStrsav(pcVar8);
    Vec_PtrPush(vecLoNames,pcVar8);
  }
  iVar17 = 0;
  if ((mode & 0xfffffffdU) == 0) {
    local_68 = Aig_ObjCreateCi(p_00);
    Vec_PtrPush(vecLos,local_68);
    Vec_PtrPush(vecLoNames,"SAVED_LO");
    local_50 = Aig_Or(p_00,pAVar6,local_68);
    local_98 = Aig_And(p_00,pAVar6,(Aig_Obj_t *)((ulong)local_68 ^ 1));
  }
  else {
    local_68 = (Aig_Obj_t *)0x0;
    local_98 = (Aig_Obj_t *)0x0;
    local_50 = (Aig_Obj_t *)0x0;
    iVar17 = 0;
  }
  for (; iVar17 < p->vObjs->nSize; iVar17 = iVar17 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar17);
    if ((pAVar5 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar5->field_0x18 & 7) - 7)) {
      pAVar6 = Aig_ObjChild0Copy(pAVar5);
      pAVar9 = Aig_ObjChild1Copy(pAVar5);
      pAVar6 = Aig_And(p_00,pAVar6,pAVar9);
      (pAVar5->field_5).pData = pAVar6;
    }
  }
  if (2 < (uint)mode) goto LAB_004a033d;
  iVar17 = vAssertSafety->nSize;
  if (iVar17 == 0) {
    puts("WARNING!! No safety property is found, a new (negated) constant 1 output is created");
    pAVar6 = p_00->pConst1;
joined_r0x0049fd71:
    pAVar6 = (Aig_Obj_t *)((ulong)pAVar6 ^ 1);
    local_78 = pAVar6;
    if ((uint)mode < 2) {
LAB_0049fdcf:
      Aig_ObjCreateCo(p_00,pAVar6);
    }
  }
  else {
    pAVar6 = p_00->pConst1;
    if (vAssumeSafety->nSize == 0) {
      for (iVar18 = 0; iVar18 < iVar17; iVar18 = iVar18 + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(vAssertSafety,iVar18);
        pAVar6 = Aig_And(p_00,(Aig_Obj_t *)
                              ((ulong)((uint)pAVar5->pFanin0 & 1) ^
                              *(ulong *)(((ulong)pAVar5->pFanin0 & 0xfffffffffffffffe) + 0x28)),
                         pAVar6);
        iVar17 = vAssertSafety->nSize;
      }
      goto joined_r0x0049fd71;
    }
    for (iVar18 = 0; iVar18 < iVar17; iVar18 = iVar18 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(vAssertSafety,iVar18);
      pAVar6 = Aig_And(p_00,(Aig_Obj_t *)
                            ((ulong)((uint)pAVar5->pFanin0 & 1) ^
                            *(ulong *)(((ulong)pAVar5->pFanin0 & 0xfffffffffffffffe) + 0x28)),pAVar6
                      );
      iVar17 = vAssertSafety->nSize;
    }
    pAVar9 = p_00->pConst1;
    for (iVar17 = 0; iVar17 < vAssumeSafety->nSize; iVar17 = iVar17 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(vAssumeSafety,iVar17);
      pAVar9 = Aig_And(p_00,(Aig_Obj_t *)
                            ((ulong)((uint)pAVar5->pFanin0 & 1) ^
                            *(ulong *)(((ulong)pAVar5->pFanin0 & 0xfffffffffffffffe) + 0x28)),pAVar9
                      );
    }
    local_78 = Aig_And(p_00,(Aig_Obj_t *)((ulong)pAVar6 ^ 1),pAVar9);
    if ((uint)mode < 2) {
      pAVar6 = Aig_And(p_00,(Aig_Obj_t *)((ulong)pAVar6 ^ 1),pAVar9);
      goto LAB_0049fdcf;
    }
  }
  if (local_78 != (Aig_Obj_t *)0x0) {
    iVar17 = 0;
    if ((mode & 0xfffffffdU) == 0) {
      local_60 = Vec_PtrAlloc(local_a0->nSize);
      for (iVar17 = 0; iVar17 < local_a0->nSize; iVar17 = iVar17 + 1) {
        pAVar6 = Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)
                                       (((ulong)pAVar5->pFanin0 & 0xfffffffffffffffe) + 0x28));
        Vec_PtrPush(local_60,pAVar6);
      }
      iVar17 = 0;
    }
    else {
      local_60 = (Vec_Ptr_t *)0x0;
    }
    for (; iVar17 < p->nRegs; iVar17 = iVar17 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,p->nTruePis + iVar17);
      pAVar5 = Saig_ObjLoToLi(p,pAVar5);
      Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                           ((ulong)((uint)pAVar5->pFanin0 & 1) ^
                           *(ulong *)(((ulong)pAVar5->pFanin0 & 0xfffffffffffffffe) + 0x28)));
    }
    if ((mode & 0xfffffffdU) == 0) {
      local_48 = Aig_ObjCreateCo(p_00,local_50);
      pAVar5 = p_00->pConst1;
      for (iVar18 = 0; iVar17 = iVar17 + 1, iVar18 < p->nRegs; iVar18 = iVar18 + 1) {
        pvVar10 = Vec_PtrEntry(p->vCis,p->nTruePis + iVar18);
        pAVar6 = Aig_ObjCreateCi(p_00);
        Vec_PtrPush(vecLos,pAVar6);
        pAVar7 = Abc_NtkCi(pNtk,pNtk->vPis->nSize + iVar18);
        pcVar8 = Abc_ObjName(pAVar7);
        sVar3 = strlen(pcVar8);
        pcVar8 = (char *)malloc(sVar3 + 10);
        pAVar7 = Abc_NtkCi(pNtk,pNtk->vPis->nSize + iVar18);
        pcVar4 = Abc_ObjName(pAVar7);
        sprintf(pcVar8,"%s__%s",pcVar4,"SHADOW");
        Vec_PtrPush(vecLoNames,pcVar8);
        pAVar9 = Aig_Mux(p_00,local_98,*(Aig_Obj_t **)((long)pvVar10 + 0x28),pAVar6);
        Aig_ObjCreateCo(p_00,pAVar9);
        pAVar6 = Aig_Exor(p_00,*(Aig_Obj_t **)((long)pvVar10 + 0x28),pAVar6);
        pAVar5 = Aig_And(p_00,(Aig_Obj_t *)((ulong)pAVar6 ^ 1),pAVar5);
      }
      pAVar5 = Aig_And(p_00,local_68,pAVar5);
      pVVar11 = Vec_PtrAlloc(10);
      p_01 = Vec_PtrAlloc(10);
      for (iVar18 = 0; iVar18 < local_a0->nSize; iVar18 = iVar18 + 1) {
        plVar12 = (ltlNode *)Vec_PtrEntry(local_a0,iVar18);
        pVVar13 = Vec_PtrAlloc(10);
        vAigGFMap = (Vec_Vec_t *)malloc(0x10);
        vAigGFMap->nCap = 10;
        vAigGFMap->nSize = 0;
        ppvVar14 = (void **)malloc(0x50);
        vAigGFMap->pArray = ppvVar14;
        populateBoolWithAigNodePtr(pNtk,p,p_00,plVar12);
        iVar1 = checkAllBoolHaveAIGPointer(plVar12);
        if (iVar1 == 0) {
          __assert_fail("checkAllBoolHaveAIGPointer( topNodeOfAST )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/liveness.c"
                        ,0x868,
                        "Aig_Man_t *LivenessToSafetyTransformationWithLTL(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, int *, Vec_Ptr_t *)"
                       );
        }
        populateAigPointerUnitGF(p_00,plVar12,pVVar13,vAigGFMap);
        for (iVar1 = 0; iVar1 < pVVar13->nSize; iVar1 = iVar1 + 1) {
          pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pVVar13,iVar1);
          iVar2 = Vec_PtrFind(pVVar11,pAVar6);
          if (iVar2 == -1) {
            pAVar9 = Aig_ObjCreateCi(p_00);
            pAVar15 = Aig_And(p_00,pAVar6,local_50);
            pAVar15 = Aig_Or(p_00,pAVar9,pAVar15);
            Aig_ObjCreateCo(p_00,pAVar15);
            iVar17 = iVar17 + 1;
            Vec_PtrPush(pVVar11,pAVar6);
            Vec_PtrPush(p_01,pAVar9);
            Vec_PtrPush(vecLos,pAVar9);
            pcVar8 = (char *)malloc(0x14);
            sprintf(pcVar8,"n%d__%s",(ulong)(uint)pAVar9->Id,"GF_flop");
            Vec_PtrPush(vecLoNames,pcVar8);
          }
          else {
            pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(p_01,iVar2);
          }
          for (iVar2 = 0; pVVar16 = Vec_VecEntry(vAigGFMap,iVar1), iVar2 < pVVar16->nSize;
              iVar2 = iVar2 + 1) {
            pVVar16 = Vec_VecEntry(vAigGFMap,iVar1);
            astNode = (ltlNode *)Vec_PtrEntry(pVVar16,iVar2);
            setAIGNodePtrOfGloballyNode(astNode,pAVar9);
          }
        }
        buildLogicFromLTLNode(p_00,plVar12);
        pAVar6 = retriveAIGPointerFromLTLNode(plVar12);
        pAVar6 = Aig_And(p_00,pAVar5,(Aig_Obj_t *)((ulong)pAVar6 ^ 1));
        puts("liveness output is conjoined with safety assertions");
        pAVar6 = Aig_Or(p_00,pAVar6,local_78);
        pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(local_60,iVar18);
        Aig_ObjPatchFanin0(p_00,pAVar9,pAVar6);
        Vec_PtrFree(pVVar13);
        for (iVar1 = 0; iVar1 < vAigGFMap->nSize; iVar1 = iVar1 + 1) {
          pVVar13 = Vec_VecEntry(vAigGFMap,iVar1);
          if (pVVar13 != (Vec_Ptr_t *)0x0) {
            Vec_PtrFree(pVVar13);
          }
        }
        Vec_PtrFree((Vec_Ptr_t *)vAigGFMap);
      }
    }
    else {
      local_48 = (Aig_Obj_t *)0x0;
    }
    Aig_ManSetRegNum(p_00,iVar17);
    Aig_ManCiCleanupBiere(p_00);
    Aig_ManCoCleanupBiere(p_00);
    Aig_ManCleanup(p_00);
    iVar17 = Aig_ManCheck(p_00);
    if (iVar17 == 0) {
      __assert_fail("Aig_ManCheck( pNew )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/liveness.c"
                    ,0x8cf,
                    "Aig_Man_t *LivenessToSafetyTransformationWithLTL(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, int *, Vec_Ptr_t *)"
                   );
    }
    if ((mode & 0xfffffffdU) == 0) {
      pVVar11 = p_00->vCos;
      iVar17 = p_00->nTruePos;
      iVar18 = Aig_ObjCioId(local_68);
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar11,~p->nTruePis + iVar17 + iVar18);
      if (pAVar5 != local_48) {
        __assert_fail("(Aig_Obj_t *)Vec_PtrEntry(pNew->vCos, Saig_ManPoNum(pNew)+Aig_ObjCioId(pObjSavedLo)-Saig_ManPiNum(p)-1) == pObjSavedLi"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/liveness.c"
                      ,0x8d3,
                      "Aig_Man_t *LivenessToSafetyTransformationWithLTL(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, int *, Vec_Ptr_t *)"
                     );
      }
      if (p->nTruePis + 1 != p_00->nTruePis) {
        __assert_fail("Saig_ManPiNum( p ) + 1 == Saig_ManPiNum( pNew )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/liveness.c"
                      ,0x8d4,
                      "Aig_Man_t *LivenessToSafetyTransformationWithLTL(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, int *, Vec_Ptr_t *)"
                     );
      }
    }
    return p_00;
  }
LAB_004a033d:
  __assert_fail("pNegatedSafetyConjunction != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/liveness.c"
                ,0x7ed,
                "Aig_Man_t *LivenessToSafetyTransformationWithLTL(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, int *, Vec_Ptr_t *)"
               );
}

Assistant:

Aig_Man_t * LivenessToSafetyTransformationWithLTL( int mode, Abc_Ntk_t * pNtk, Aig_Man_t * p, 
										   Vec_Ptr_t *vLive, Vec_Ptr_t *vFair, Vec_Ptr_t *vAssertSafety, Vec_Ptr_t *vAssumeSafety,
										   int *numLtlProcessed, Vec_Ptr_t *ltlBuffer )
{
	Aig_Man_t * pNew;
	int i, ii, iii, nRegCount;
	Aig_Obj_t * pObjSavePi = NULL;
	Aig_Obj_t *pObjSavedLo = NULL, *pObjSavedLi = NULL;
	Aig_Obj_t *pObj, *pMatch;
	Aig_Obj_t *pObjSaveOrSaved = NULL, *pObjSaveAndNotSaved = NULL, *pObjSavedLoAndEquality;
	Aig_Obj_t *pObjShadowLo, *pObjShadowLi, *pObjShadowLiDriver;
	Aig_Obj_t *pObjXor, *pObjXnor, *pObjAndAcc;
	Aig_Obj_t *pObjLive, *pObjSafetyGate;
	Aig_Obj_t *pObjSafetyPropertyOutput;
	Aig_Obj_t *pObjOriginalSafetyPropertyOutput;
	Aig_Obj_t *pDriverImage, *pArgument, *collectiveAssertSafety, *collectiveAssumeSafety;
	Aig_Obj_t *pNegatedSafetyConjunction = NULL;
	Aig_Obj_t *pObjSafetyAndLiveToSafety;
	char *nodeName, *pFormula;
	int piCopied = 0, liCopied = 0, loCopied = 0, liCreated = 0, loCreated = 0, liveLatch = 0;//, piVecIndex = 0, fairLatch = 0;
	Vec_Ptr_t *vSignal, *vTopASTNodeArray = NULL;
	ltlNode *pEnrtyGLOBALLY;
	ltlNode *topNodeOfAST, *tempTopASTNode;
	Vec_Vec_t *vAigGFMap;
	Vec_Ptr_t *vSignalMemory, *vGFFlopMemory, *vPoForLtlProps = NULL;
	Vec_Ptr_t *vecInputLtlFormulae;
	
	vecPis = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);
	vecPiNames = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);

	vecLos = Vec_PtrAlloc( Saig_ManRegNum( p )*2 + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );
	vecLoNames = Vec_PtrAlloc( Saig_ManRegNum( p )*2 + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );

	//****************************************************************
	//step0: Parsing the LTL formula
	//****************************************************************
	//Vec_PtrForEachEntry( char *, pNtk->vLtlProperties, pFormula, i )
	//	printf("\ninput LTL formula [%d] = %s\n", i, pFormula );


#ifdef MULTIPLE_LTL_FORMULA


	//***************************************************************************
	//Reading input LTL formulae from Ntk data-structure and creating 
	//AST for them, Steps involved: 
	//		parsing -> AST creation -> well-formedness check -> signal name check
	//***************************************************************************

	//resetting numLtlProcessed
	*numLtlProcessed = 0;
	
	if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
	{
		//if( ltlBuffer )
		vecInputLtlFormulae = ltlBuffer;
		//vecInputLtlFormulae = pNtk->vLtlProperties;
		if( vecInputLtlFormulae )
		{
			vTopASTNodeArray = Vec_PtrAlloc( Vec_PtrSize( vecInputLtlFormulae ) );
			printf("\n");
			Vec_PtrForEachEntry( char *, vecInputLtlFormulae, pFormula, i )
			{
				tempTopASTNode = parseFormulaCreateAST( pFormula );
				//traverseAbstractSyntaxTree_postFix( tempTopASTNode );
				if( tempTopASTNode )
				{
					printf("Formula %d: AST is created, ", i+1);
					if( isWellFormed( tempTopASTNode ) )
						printf("Well-formedness check PASSED, ");
					else
					{
						printf("Well-formedness check FAILED!!\n");
						printf("AST will be ignored for formula %d, no extra logic will be added for this formula\n", i+1 );
						//do memory management to free the created AST
						continue;
					}
					if( checkSignalNameExistence( pNtk, tempTopASTNode ) )
						printf("Signal check PASSED\n");
					else
					{
						printf("Signal check FAILED!!");
						printf("AST will be ignored for formula %d, no extra logic will be added for this formula\n", i+1 );
						//do memory management to free the created AST
						continue;
					}
					Vec_PtrPush( vTopASTNodeArray, tempTopASTNode );
					(*numLtlProcessed)++;
				}
				else
					printf("\nNo AST has been created for formula %d, no extra logic will be added\n", i+1 );
			}
		}
		printf("\n");
		if( Vec_PtrSize( vTopASTNodeArray ) == 0 )
		{
			//printf("\nNo AST has been created for any formula; hence the circuit is left untouched\n");
			printf("\nCurrently aborting, need to take care when Vec_PtrSize( vTopASTNodeArray ) == 0\n");
			exit(0);
		}
	}

		//****************************************************************
		// Step1: create the new manager
		// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
		// nodes, but this selection is arbitrary - need to be justified
		//****************************************************************
		pNew = Aig_ManStart( 2 * Aig_ManObjNumMax(p) );
		pNew->pName = (char *)malloc( strlen( pNtk->pName ) + strlen("_l3s") + 1 );
		sprintf(pNew->pName, "%s_%s", pNtk->pName, "l3s");
		pNew->pSpec = NULL;
    
		//****************************************************************
		// Step 2: map constant nodes
		//****************************************************************
		pObj = Aig_ManConst1( p );
		pObj->pData = Aig_ManConst1( pNew );

		//****************************************************************
		// Step 3: create true PIs
		//****************************************************************
		Saig_ManForEachPi( p, pObj, i )
		{
			piCopied++;
			pObj->pData = Aig_ObjCreateCi(pNew);
			Vec_PtrPush( vecPis, pObj->pData );
			nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkPi( pNtk, i ) ));
			Vec_PtrPush( vecPiNames, nodeName );
		}

		//****************************************************************
		// Step 4: create the special Pi corresponding to SAVE
		//****************************************************************
		if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
		{
			pObjSavePi = Aig_ObjCreateCi( pNew );
			nodeName = "SAVE_BIERE",
			Vec_PtrPush( vecPiNames, nodeName );
		}
		
		//****************************************************************
		// Step 5: create register outputs
		//****************************************************************
		Saig_ManForEachLo( p, pObj, i )
		{
			loCopied++;
			pObj->pData = Aig_ObjCreateCi(pNew);
			Vec_PtrPush( vecLos, pObj->pData );
			nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ));
			Vec_PtrPush( vecLoNames, nodeName );
		}

		//****************************************************************
		// Step 6: create "saved" register output
		//****************************************************************
		if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
		{
			loCreated++;
			pObjSavedLo = Aig_ObjCreateCi( pNew );
			Vec_PtrPush( vecLos, pObjSavedLo );
			nodeName = "SAVED_LO";
			Vec_PtrPush( vecLoNames, nodeName );
		}

		//****************************************************************
		// Step 7: create the OR gate and the AND gate directly fed by "SAVE" Pi
		//****************************************************************
		if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
		{
			pObjSaveOrSaved = Aig_Or( pNew, pObjSavePi, pObjSavedLo );
			pObjSaveAndNotSaved = Aig_And( pNew, pObjSavePi, Aig_Not(pObjSavedLo) );
		}

		//********************************************************************
		// Step 8: create internal nodes
		//********************************************************************
		Aig_ManForEachNode( p, pObj, i )
		{
			pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
		}

		
		//********************************************************************
		// Step 8.x : create PO for each safety assertions
		// NOTE : Here the output is purposely inverted as it will be thrown to 
		// dprove
		//********************************************************************
		assert( pNegatedSafetyConjunction == NULL );
		if( mode == FULL_BIERE_MODE || mode == IGNORE_LIVENESS_KEEP_SAFETY_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE)
		{
			if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) == 0 )
			{
				pObjAndAcc = Aig_ManConst1( pNew );
				Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
				{
					pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
					pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
				}
				pNegatedSafetyConjunction = Aig_Not(pObjAndAcc);
				if( mode == FULL_BIERE_MODE || mode == IGNORE_LIVENESS_KEEP_SAFETY_MODE )
					pObjOriginalSafetyPropertyOutput = Aig_ObjCreateCo( pNew, Aig_Not(pObjAndAcc) );
			}
			else if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) != 0 )
			{
				pObjAndAcc = Aig_ManConst1( pNew );
				Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
				{
					pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
					pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
				}
				collectiveAssertSafety = pObjAndAcc;

				pObjAndAcc = Aig_ManConst1( pNew );
				Vec_PtrForEachEntry( Aig_Obj_t *, vAssumeSafety, pObj, i )
				{
					pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
					pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
				}
				collectiveAssumeSafety = pObjAndAcc;
				pNegatedSafetyConjunction =  Aig_And( pNew, Aig_Not(collectiveAssertSafety), collectiveAssumeSafety );
				if( mode == FULL_BIERE_MODE || mode == IGNORE_LIVENESS_KEEP_SAFETY_MODE )
					pObjOriginalSafetyPropertyOutput = Aig_ObjCreateCo( pNew, Aig_And( pNew, Aig_Not(collectiveAssertSafety), collectiveAssumeSafety ) );
			}
			else
			{
				printf("WARNING!! No safety property is found, a new (negated) constant 1 output is created\n");
				pNegatedSafetyConjunction = Aig_Not( Aig_ManConst1(pNew) );
				if( mode == FULL_BIERE_MODE || mode == IGNORE_LIVENESS_KEEP_SAFETY_MODE )
					pObjOriginalSafetyPropertyOutput = Aig_ObjCreateCo( pNew, Aig_Not( Aig_ManConst1(pNew) ) );
			}
		}
		assert( pNegatedSafetyConjunction != NULL );

		//********************************************************************
		// Step 9: create the safety property output gate for the liveness properties
		// discuss with Sat/Alan for an alternative implementation
		//********************************************************************
		if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
		{
			vPoForLtlProps = Vec_PtrAlloc( Vec_PtrSize( vTopASTNodeArray ) );
			if( Vec_PtrSize( vTopASTNodeArray ) )
			{
				//no effective AST for any input LTL property
				//must do something graceful
			}
			for( i=0; i<Vec_PtrSize( vTopASTNodeArray ); i++ )
			{
				pObjSafetyPropertyOutput = Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
				Vec_PtrPush( vPoForLtlProps, pObjSafetyPropertyOutput );
			}
		}

		//*************************************************************************************
		// Step 10: Placeholder PO's were created for Liveness property outputs in the
		// last step. FYI, # of new liveness property outputs = # of LTL properties in the circuit
		// It is time for creation of loop LI's and other stuff
		// Now creating register inputs for the original flops
		//*************************************************************************************
		nRegCount = 0;
		
		Saig_ManForEachLo( p, pObj, i )
		{
			pMatch = Saig_ObjLoToLi( p, pObj );
			Aig_ObjCreateCo( pNew, Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pMatch)->pData, Aig_ObjFaninC0( pMatch ) ) );
			nRegCount++;
			liCopied++;
		}

		//*************************************************************************************
		// Step 11: create register input corresponding to the register "saved"
		//*************************************************************************************
		if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
		{
			#ifndef DUPLICATE_CKT_DEBUG
				pObjSavedLi = Aig_ObjCreateCo( pNew, pObjSaveOrSaved );
				nRegCount++;
				liCreated++;

				pObjAndAcc = Aig_ManConst1( pNew );

				//*************************************************************************************
				// Step 11: create the family of shadow registers, then create the cascade of Xnor 
				// and And gates for the comparator 
				//*************************************************************************************
				Saig_ManForEachLo( p, pObj, i )
				{
				//printf("\nKEMON RENDY = %s", Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i )) );
				//top|route0_target0_queue_with_credit0_queue0
				//top|route0_master0_queue2
				//	if( strcmp(  Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ), "top|route0_queue1_num[0]" ) == 0 
				//			|| strcmp(  Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ), "top|route0_queue1_num[1]" ) == 0 || strcmp(  Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ), "top|route0_queue1_num[2]" ) == 0 )
					{		
						pObjShadowLo = Aig_ObjCreateCi( pNew );

					#ifdef PROPAGATE_NAMES
						Vec_PtrPush( vecLos, pObjShadowLo );
						nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ) ) + 10 );
						sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ), "SHADOW" );
						
						Vec_PtrPush( vecLoNames, nodeName );
					#endif

						pObjShadowLiDriver = Aig_Mux( pNew, pObjSaveAndNotSaved, (Aig_Obj_t *)pObj->pData, pObjShadowLo );
						pObjShadowLi = Aig_ObjCreateCo( pNew, pObjShadowLiDriver );
						nRegCount++;
						loCreated++; liCreated++;
			
						pObjXor = Aig_Exor( pNew, (Aig_Obj_t *)pObj->pData, pObjShadowLo );
						pObjXnor = Aig_Not( pObjXor );
					
						pObjAndAcc = Aig_And( pNew, pObjXnor, pObjAndAcc );
					}
				}

				// create the AND gate whose output will be the signal "looped"
				pObjSavedLoAndEquality = Aig_And( pNew, pObjSavedLo, pObjAndAcc );

				// create the master AND gate and corresponding AND and OR logic for the liveness properties
				
				//*************************************************************************************
				// Step 11: logic for LTL properties:- (looped & ~theta) where theta is the input ltl 
				// property
				// Description of some data-structure:
				//-------------------------------------------------------------------------------------
				// Name          | Type            | Purpose
				//-------------------------------------------------------------------------------------
				// vSignalMemory | Vec_Ptr_t *     | A vector across all ASTs of the LTL properties
				//				 |				   | It remembers if OR+Latch for GF node has already been
				//				 |				   | created for a particular signal.
				//               |                 |
				// vGFFlopMemory | Vec_Ptr_t *     | A vector across all ASTs of the LTL properties
				//				 |                 | remembers if OR+Latch of a GF node has already been created
				//				 |                 |
				// vSignal		 | Vec_Ptr_t *     | vector for each AST; contains pointers from GF nodes
				//               |                 | to AIG signals
				//				 |				   |
				// vAigGFMap	 | Vec_Vec_t *     | vAigGFMap[ index ] = vector of GF nodes pointing to
				//               |                 | the same AIG node; "index" is the index of that
				//               |                 | AIG node in the vector vSignal
				//*************************************************************************************
				
				vSignalMemory = Vec_PtrAlloc(10);
				vGFFlopMemory = Vec_PtrAlloc(10);

				Vec_PtrForEachEntry( ltlNode *, vTopASTNodeArray, topNodeOfAST, iii )
				{
									vSignal = Vec_PtrAlloc( 10 );
									vAigGFMap = Vec_VecAlloc( 10 );
									
									//*************************************************************************************
									//Step 11a: for the current AST, find out the leaf level Boolean signal pointers from 
									// the NEW aig.
									//*************************************************************************************
									populateBoolWithAigNodePtr( pNtk, p, pNew, topNodeOfAST );
									assert( checkAllBoolHaveAIGPointer( topNodeOfAST ) );

									//*************************************************************************************
									//Step 11b: for each GF node, compute the pointer in AIG that it should point to
									// In particular, if the subtree below GF is some Boolean crown (including the case
									// of simple negation, create new logic and populate the AIG pointer in GF node
									// accordingly
									//*************************************************************************************
									populateAigPointerUnitGF( pNew, topNodeOfAST, vSignal, vAigGFMap );
									
									//*************************************************************************************
									//Step 11c: everything below GF are computed. Now, it is time to create logic for individual 
									// GF nodes (i.e. the OR gate and the latch and the Boolean crown of the AST
									//*************************************************************************************
									Vec_PtrForEachEntry( Aig_Obj_t *, vSignal, pObj, i )
									{
										//*********************************************************
										// Step 11c.1: if the OR+Latch of the particular signal is
										// not already created, create it. It may have already been 
										// created from another property, so check it before creation
										//*********************************************************
										if( Vec_PtrFind( vSignalMemory, pObj ) == -1 )
										{
											liveLatch++;

											pDriverImage = pObj;
											pObjShadowLo = Aig_ObjCreateCi( pNew );
											pObjShadowLiDriver = Aig_Or( pNew, pObjShadowLo, Aig_And( pNew, pDriverImage, pObjSaveOrSaved ) );
											pObjShadowLi = Aig_ObjCreateCo( pNew, pObjShadowLiDriver );

											nRegCount++;
											loCreated++; liCreated++;

											Vec_PtrPush( vSignalMemory, pObj );
											Vec_PtrPush( vGFFlopMemory, pObjShadowLo );

											#if 1
											#ifdef PROPAGATE_NAMES
												Vec_PtrPush( vecLos, pObjShadowLo );
												//nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ) ) + 12 );
												//sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ), "LIVENESS" );
												nodeName = (char *)malloc( 20 );
												sprintf( nodeName, "n%d__%s", Aig_ObjId(pObjShadowLo), "GF_flop" );
												Vec_PtrPush( vecLoNames, nodeName );
											#endif
											#endif
										}
										else
											pObjShadowLo = (Aig_Obj_t *)Vec_PtrEntry( vGFFlopMemory, Vec_PtrFind( vSignalMemory, pObj ) );
																				
										Vec_VecForEachEntryLevel( ltlNode *, vAigGFMap, pEnrtyGLOBALLY, ii, i )
											setAIGNodePtrOfGloballyNode( pEnrtyGLOBALLY, pObjShadowLo);
											

										//#ifdef PROPAGATE_NAMES
										//	Vec_PtrPush( vecLos, pObjShadowLo );
										//	nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ) ) + 12 );
										//	sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ), "LIVENESS" );
										//	Vec_PtrPush( vecLoNames, nodeName );
										//#endif
										
									}
									
									//*********************************************************
									//Step 11c.2: creating the Boolean crown
									//*********************************************************
									buildLogicFromLTLNode( pNew, topNodeOfAST );

									//*********************************************************
									//Step 11c.3: creating logic for (looped & ~theta) and patching
									// it with the proper PO
									//Note: if ALLOW_SAFETY_PROPERTIES is defined then the final AND
									//gate is a conjunction of safety & liveness, i.e. SAFETY & (looped => theta)
									//since ABC convention demands a NOT gate at the end, the property logic 
									//becomes !( SAFETY & (looped => theta) ) = !SAFETY + (looped & !theta)
									//*********************************************************
									pObjLive = retriveAIGPointerFromLTLNode( topNodeOfAST );
									pObjSafetyGate = Aig_And( pNew, pObjSavedLoAndEquality, Aig_Not(pObjLive) );
									#ifdef ALLOW_SAFETY_PROPERTIES
										printf("liveness output is conjoined with safety assertions\n");
										pObjSafetyAndLiveToSafety = Aig_Or( pNew, pObjSafetyGate, pNegatedSafetyConjunction );
										pObjSafetyPropertyOutput = (Aig_Obj_t *)Vec_PtrEntry( vPoForLtlProps, iii );
										Aig_ObjPatchFanin0( pNew, pObjSafetyPropertyOutput, pObjSafetyAndLiveToSafety );
									#else
										pObjSafetyPropertyOutput = Vec_PtrEntry( vPoForLtlProps, iii );
										Aig_ObjPatchFanin0( pNew, pObjSafetyPropertyOutput, pObjSafetyGate );
									#endif
									//refreshing vSignal and vAigGFMap arrays
									Vec_PtrFree( vSignal );
									Vec_VecFree( vAigGFMap );
				}
								
			#endif
		}
#endif

	Aig_ManSetRegNum( pNew, nRegCount );

	Aig_ManCiCleanupBiere( pNew );
	Aig_ManCoCleanupBiere( pNew );
	
	Aig_ManCleanup( pNew );
	
	assert( Aig_ManCheck( pNew ) );
	
	if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
	{
			assert((Aig_Obj_t *)Vec_PtrEntry(pNew->vCos, Saig_ManPoNum(pNew)+Aig_ObjCioId(pObjSavedLo)-Saig_ManPiNum(p)-1) == pObjSavedLi);
			assert( Saig_ManPiNum( p ) + 1 == Saig_ManPiNum( pNew ) );
			//assert( Saig_ManRegNum( pNew ) == Saig_ManRegNum( p ) * 2 + 1 + liveLatch + fairLatch );
	}


	return pNew;
}